

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FBI.H
# Opt level: O2

void __thiscall
amrex::FabArray<amrex::EBCellFlagFab>::FB_local_copy_cpu
          (FabArray<amrex::EBCellFlagFab> *this,FB *TheFB,int scomp,int ncomp)

{
  Box *pBVar1;
  undefined8 *puVar2;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *pvVar3;
  pointer pFVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer pVVar7;
  int iVar8;
  ulong uVar9;
  EBCellFlagFab *pEVar10;
  EBCellFlagFab *this_00;
  vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>>>
  *this_01;
  long lVar11;
  long lVar12;
  long lVar13;
  FabCopyTag<amrex::EBCellFlagFab> *tag;
  ulong uVar14;
  pointer pFVar15;
  Array4<amrex::EBCellFlag> dfab;
  MFIter mfi;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  loc_copy_tags;
  anon_class_152_4_dcf20601 local_278;
  Array4<amrex::EBCellFlag> local_1e0;
  MFIter local_1a0;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  local_140;
  
  pvVar3 = (TheFB->super_CommMetaData).m_LocTags._M_t.
           super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
           .
           super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
           ._M_head_impl;
  uVar9 = (ulong)((long)*(pointer *)
                         ((long)&(pvVar3->
                                 super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                 )._M_impl + 8) -
                 *(long *)&(pvVar3->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl) >> 6;
  iVar8 = (int)uVar9;
  if (iVar8 != 0) {
    if ((TheFB->super_CommMetaData).m_threadsafe_loc == true) {
      uVar14 = 0;
      uVar9 = uVar9 & 0xffffffff;
      if (iVar8 < 1) {
        uVar9 = uVar14;
      }
      for (; uVar9 << 6 != uVar14; uVar14 = uVar14 + 0x40) {
        lVar12 = *(long *)&(pvVar3->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl;
        lVar11 = lVar12 + uVar14;
        pEVar10 = fabPtr(this,*(int *)(lVar11 + 0x3c));
        this_00 = fabPtr(this,*(int *)(lVar11 + 0x38));
        BaseFab<amrex::EBCellFlag>::copy<(amrex::RunOn)1>
                  (&this_00->super_BaseFab<amrex::EBCellFlag>,
                   &pEVar10->super_BaseFab<amrex::EBCellFlag>,(Box *)(lVar11 + 0x1c),scomp,
                   (Box *)(lVar12 + uVar14),scomp,ncomp);
      }
    }
    else {
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
      ::LayoutData(&local_140,&(this->super_FabArrayBase).boxarray,
                   &(this->super_FabArrayBase).distributionMap);
      uVar14 = 0;
      uVar9 = uVar9 & 0xffffffff;
      if (iVar8 < 1) {
        uVar9 = uVar14;
      }
      for (; uVar9 * 0x40 != uVar14; uVar14 = uVar14 + 0x40) {
        lVar11 = *(long *)&(pvVar3->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl;
        this_01 = (vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>>>
                   *)LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                     ::operator[](&local_140,*(int *)(lVar11 + 0x38 + uVar14));
        local_278.dfab.p = (EBCellFlag *)fabPtr(this,*(int *)(lVar11 + 0x3c + uVar14));
        local_278.dfab.jstride = *(Long *)(lVar11 + uVar14);
        puVar2 = (undefined8 *)(lVar11 + 0xc + uVar14);
        uVar5 = *puVar2;
        uVar6 = puVar2[1];
        local_278.dfab.kstride._0_4_ = (undefined4)((Long *)(lVar11 + uVar14))[1];
        local_278.dfab.kstride._4_4_ = (undefined4)uVar5;
        local_278.dfab.nstride._0_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        local_278.dfab.nstride._4_4_ = (undefined4)uVar6;
        local_278.dfab.begin.x = (int)((ulong)uVar6 >> 0x20);
        local_278.dfab.begin.y = *(int *)(lVar11 + 0x1c + uVar14) - *(int *)(lVar11 + uVar14);
        local_278.dfab.begin.z = *(int *)(lVar11 + 0x20 + uVar14) - *(int *)(lVar11 + 4 + uVar14);
        local_278.dfab.end.x = *(int *)(lVar11 + 0x24 + uVar14) - *(int *)(lVar11 + 8 + uVar14);
        std::
        vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>>>
        ::emplace_back<amrex::FabCopyTag<amrex::EBCellFlagFab>>
                  (this_01,(FabCopyTag<amrex::EBCellFlagFab> *)&local_278);
      }
      MFIter::MFIter(&local_1a0,&this->super_FabArrayBase,'\0');
      while( true ) {
        pVVar7 = local_140.m_data.
                 super_vector<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>,_std::allocator<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_1a0.endIndex <= local_1a0.currentIndex) break;
        iVar8 = local_1a0.currentIndex;
        if (local_1a0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar8 = ((local_1a0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[local_1a0.currentIndex];
        }
        array<amrex::EBCellFlagFab,_0>(&local_1e0,this,&local_1a0);
        pFVar4 = pVVar7[iVar8].
                 super_vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                 .
                 super__Vector_base<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pFVar15 = pVVar7[iVar8].
                       super_vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                       .
                       super__Vector_base<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pFVar15 != pFVar4;
            pFVar15 = pFVar15 + 1) {
          pEVar10 = pFVar15->sfab;
          local_278.offset.x = (pFVar15->offset).vect[0];
          local_278.offset.y = (pFVar15->offset).vect[1];
          local_278.sfab.p = (pEVar10->super_BaseFab<amrex::EBCellFlag>).dptr;
          local_278.sfab.ncomp = (pEVar10->super_BaseFab<amrex::EBCellFlag>).nvar;
          pBVar1 = &(pEVar10->super_BaseFab<amrex::EBCellFlag>).domain;
          local_278.sfab.begin.z =
               (pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
          local_278.sfab.begin.x = (pBVar1->smallend).vect[0];
          local_278.sfab.begin.y = (pBVar1->smallend).vect[1];
          lVar12 = (long)(pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
          lVar13 = (long)(pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
          lVar11 = (long)(pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
          local_278.sfab.jstride = (lVar13 - (pBVar1->smallend).vect[0]) + 1;
          local_278.sfab.kstride =
               (lVar12 - (pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
               local_278.sfab.jstride;
          local_278.sfab.nstride = (lVar11 - local_278.sfab.begin.z) * local_278.sfab.kstride;
          local_278.sfab.end._0_8_ = lVar13 + 1U & 0xffffffff | lVar12 << 0x20;
          local_278.offset.z = (pFVar15->offset).vect[2];
          local_278.dfab.end.z = local_1e0.end.z;
          local_278.dfab.ncomp = local_1e0.ncomp;
          local_278.dfab.begin.x = local_1e0.begin.x;
          local_278.dfab.begin.y = local_1e0.begin.y;
          local_278.dfab.begin.z = local_1e0.begin.z;
          local_278.dfab.end.x = local_1e0.end.x;
          local_278.dfab.kstride._0_4_ = (undefined4)local_1e0.kstride;
          local_278.dfab.kstride._4_4_ = (undefined4)((ulong)local_1e0.kstride >> 0x20);
          local_278.dfab.nstride._0_4_ = (undefined4)local_1e0.nstride;
          local_278.dfab.nstride._4_4_ = (undefined4)((ulong)local_1e0.nstride >> 0x20);
          local_278.dfab.p = local_1e0.p;
          local_278.dfab.jstride = local_1e0.jstride;
          local_278.sfab.end.z = (int)lVar11;
          local_278.scomp = scomp;
          LoopConcurrentOnCpu<amrex::FabArray<amrex::EBCellFlagFab>::FB_local_copy_cpu(amrex::FabArrayBase::FB_const&,int,int)::_lambda(int,int,int,int)_1_>
                    (&pFVar15->dbox,ncomp,&local_278);
        }
        MFIter::operator++(&local_1a0);
      }
      MFIter::~MFIter(&local_1a0);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
      ::~LayoutData(&local_140);
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::FB_local_copy_cpu (const FB& TheFB, int scomp, int ncomp)
{
    auto const& LocTags = *(TheFB.m_LocTags);
    int N_locs = LocTags.size();
    if (N_locs == 0) return;
    bool is_thread_safe = TheFB.m_threadsafe_loc;
    if (is_thread_safe)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = LocTags[i];

            BL_ASSERT(distributionMap[tag.dstIndex] == ParallelDescriptor::MyProc());
            BL_ASSERT(distributionMap[tag.srcIndex] == ParallelDescriptor::MyProc());

            const FAB* sfab = &(get(tag.srcIndex));
                  FAB* dfab = &(get(tag.dstIndex));
            dfab->template copy<RunOn::Host>(*sfab, tag.sbox, scomp, tag.dbox, scomp, ncomp);
        }
    }
    else
    {
        LayoutData<Vector<FabCopyTag<FAB> > > loc_copy_tags(boxArray(),DistributionMap());
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = LocTags[i];

            BL_ASSERT(distributionMap[tag.dstIndex] == ParallelDescriptor::MyProc());
            BL_ASSERT(distributionMap[tag.srcIndex] == ParallelDescriptor::MyProc());

            loc_copy_tags[tag.dstIndex].push_back
                ({this->fabPtr(tag.srcIndex), tag.dbox, tag.sbox.smallEnd()-tag.dbox.smallEnd()});
        }
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            const auto& tags = loc_copy_tags[mfi];
            auto dfab = this->array(mfi);
            for (auto const & tag : tags)
            {
                auto const sfab = tag.sfab->array();
                const auto offset = tag.offset.dim3();
                amrex::LoopConcurrentOnCpu(tag.dbox, ncomp,
                [=] (int i, int j, int k, int n) noexcept
                {
                    dfab(i,j,k,n+scomp) = sfab(i+offset.x,j+offset.y,k+offset.z,n+scomp);
                });
            }
        }
    }
}